

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

type_caster<std::vector<long,_std::allocator<long>_>,_void> *
pybind11::detail::load_type<std::vector<long,std::allocator<long>>,void>
          (type_caster<std::vector<long,_std::allocator<long>_>,_void> *conv,handle *handle)

{
  bool bVar1;
  cast_error *this;
  type_caster<std::vector<long,_std::allocator<long>_>,_void> *in_RDI;
  bool in_stack_000000af;
  list_caster<std::vector<long,_std::allocator<long>_>,_long> *in_stack_000000b0;
  handle in_stack_000000b8;
  char *in_stack_ffffffffffffffc8;
  
  bVar1 = list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
                    (in_stack_000000b0,in_stack_000000b8,in_stack_000000af);
  if (!bVar1) {
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this,in_stack_ffffffffffffffc8);
    __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
  }
  return in_RDI;
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(type::handle_of(handle)) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}